

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# changesoplex.hpp
# Opt level: O1

void __thiscall
soplex::SPxSolverBase<double>::changeLhs
          (SPxSolverBase<double> *this,int i,double *newLhs,bool scale)

{
  double dVar1;
  SPxScaler<double> *pSVar2;
  undefined7 in_register_00000009;
  double extraout_XMM0_Qa;
  double dVar3;
  
  dVar1 = *newLhs;
  if (((int)CONCAT71(in_register_00000009,scale) == 0) ||
     ((this->super_SPxLPBase<double>)._isScaled != true)) {
    dVar3 = (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.left.val.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start[i];
  }
  else {
    pSVar2 = (this->super_SPxLPBase<double>).lp_scaler;
    (*pSVar2->_vptr_SPxScaler[0x1f])(pSVar2,this,i);
    dVar3 = extraout_XMM0_Qa;
  }
  if ((dVar1 != dVar3) || (NAN(dVar1) || NAN(dVar3))) {
    this->m_nonbasicValue = 0.0;
    this->m_nonbasicValueUpToDate = false;
    dVar1 = (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.left.val.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start[i];
    SPxLPBase<double>::changeLhs(&this->super_SPxLPBase<double>,i,newLhs,scale);
    if (NO_PROBLEM < (this->super_SPxBasisBase<double>).thestatus) {
      (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
        super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x6b])
                ((this->super_SPxLPBase<double>).super_LPRowSetBase<double>.left.val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[i],dVar1,this,i);
      (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
        super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x77])(this);
      return;
    }
  }
  return;
}

Assistant:

void SPxSolverBase<R>::changeLhs(int i, const R& newLhs, bool scale)
{
   if(newLhs != (scale ? this->lhsUnscaled(i) : this->lhs(i)))
   {
      forceRecompNonbasicValue();

      R oldLhs = this->lhs(i);
      SPxLPBase<R>::changeLhs(i, newLhs, scale);

      if(SPxBasisBase<R>::status() > SPxBasisBase<R>::NO_PROBLEM)
      {
         changeLhsStatus(i, this->lhs(i), oldLhs);
         unInit();
      }
   }
}